

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  xmlChar *pxVar1;
  
  if ((-1 < len && (str != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) &&
     (((end == '\0' && end2 == '\0') && end3 == '\0') && str[(uint)len] == '\0')) {
    pxVar1 = xmlExpandEntitiesInAttValue(ctxt,str,0);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
                           int what ATTRIBUTE_UNUSED,
                           xmlChar end, xmlChar end2, xmlChar end3) {
    if ((ctxt == NULL) || (str == NULL) || (len < 0))
        return(NULL);

    if ((str[len] != 0) ||
        (end != 0) || (end2 != 0) || (end3 != 0))
        return(NULL);

    return(xmlExpandEntitiesInAttValue(ctxt, str, 0));
}